

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  size_t *psVar1;
  char cVar2;
  int iVar3;
  BaseType BVar4;
  uint value;
  size_t sVar5;
  Variant *pVVar6;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pSVar7;
  SPIRVariable *pSVar8;
  pointer pcVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  undefined2 uVar13;
  Dim DVar14;
  bool bVar15;
  undefined1 uVar16;
  ImageFormat IVar17;
  AccessQualifier AVar18;
  TypeID TVar19;
  undefined8 *puVar20;
  bool bVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  TypeID TVar25;
  ID IVar26;
  long lVar27;
  key_type kVar28;
  mapped_type *pmVar29;
  ulong uVar30;
  long *plVar31;
  char *pcVar32;
  SPIRType *pSVar33;
  SPIRType *pSVar34;
  undefined8 *puVar35;
  MSLResourceBinding *rez_bind;
  SPIRType *pSVar36;
  SPIRType *pSVar37;
  const_iterator cVar38;
  mapped_type *pmVar39;
  const_iterator cVar40;
  const_iterator cVar41;
  SPIRVariable *pSVar42;
  runtime_error *prVar43;
  AlignedBuffer<Resource,_8UL> *pAVar44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar45;
  uint *ts_1;
  string *psVar46;
  SPIRVariable *pSVar47;
  size_type *psVar48;
  ID id;
  SmallVector<Resource,_8UL> *this_00;
  MSLConstexprSampler *pMVar49;
  CompilerMSL *this_01;
  MSLResourceBinding *in_R8;
  size_t sVar50;
  CompilerMSL *pCVar51;
  ulong uVar52;
  pair<unsigned_int,_unsigned_int> pVar53;
  long lVar54;
  undefined8 *puVar55;
  Resource *pRVar56;
  byte bVar57;
  bool needs_buffer_sizes;
  uint32_t var_id;
  uint32_t uint_ptr_type_id;
  uint32_t ptr_type_id;
  SPIRType uint_type_pointer;
  __hashtable *__h;
  bool set_needs_buffer_sizes [8];
  bool set_needs_swizzle_buffer [8];
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  SmallVector<Resource,_8UL> resources_in_set [8];
  CompilerMSL *pCVar58;
  char local_13a1;
  SPIRType *local_13a0;
  key_type local_1398;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_1390;
  uint32_t local_1388;
  uint local_1384;
  SPIRType *local_1380;
  Resource *local_1378;
  uint32_t local_136c;
  MSLConstexprSampler *local_1368;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1360;
  ParsedIR *local_1358;
  undefined1 local_1350 [36];
  uint32_t local_132c;
  LoopLock local_1328 [2];
  uint32_t local_1318 [4];
  undefined1 local_1308 [16];
  string local_12f8;
  undefined8 local_12d8;
  uint local_12d0 [8];
  bool *local_12b0;
  size_t local_12a8;
  size_t local_12a0;
  bool local_1298 [8];
  uint32_t local_1290;
  undefined2 local_128c;
  StorageClass local_1288;
  TypedID<(spirv_cross::Types)1> *local_1280;
  size_t local_1278;
  size_t local_1270;
  TypedID<(spirv_cross::Types)1> local_1268 [8];
  uint *local_1248;
  size_t local_1240;
  size_t local_1238;
  uint local_1230 [8];
  TypeID local_1210;
  undefined8 local_11f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_11f0;
  key_type local_11b8;
  map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
  *local_11b0;
  _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_11a8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_11a0;
  char local_1198 [16];
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *local_1188;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1180;
  _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_1178;
  undefined1 local_1170 [56];
  string local_1138;
  string local_1118;
  SmallVector<Resource,_8UL> local_10f8 [8];
  
  bVar57 = 0;
  this->argument_buffer_ids[4] = 0;
  this->argument_buffer_ids[5] = 0;
  this->argument_buffer_ids[6] = 0;
  this->argument_buffer_ids[7] = 0;
  this->argument_buffer_ids[0] = 0;
  this->argument_buffer_ids[1] = 0;
  this->argument_buffer_ids[2] = 0;
  this->argument_buffer_ids[3] = 0;
  lVar27 = 0x10c0;
  pAVar44 = &local_10f8[0].stack_storage;
  do {
    *(undefined8 *)((long)(pAVar44 + -1) + 0x1f0) = 0;
    *(AlignedBuffer<Resource,_8UL> **)((long)(pAVar44 + -1) + 0x1e8) = pAVar44;
    *(undefined8 *)((long)(pAVar44 + -1) + 0x1f8) = 8;
    pAVar44 = (AlignedBuffer<Resource,_8UL> *)((long)(pAVar44 + 1) + 0x18);
    lVar27 = lVar27 + -0x218;
  } while (lVar27 != 0);
  local_1170._0_8_ = local_1170 + 0x18;
  local_1170._8_8_ = 0;
  local_1170._16_8_ = 8;
  local_1198[8] = '\0';
  local_1198[9] = '\0';
  local_1198[10] = '\0';
  local_1198[0xb] = '\0';
  local_1198[0xc] = '\0';
  local_1198[0xd] = '\0';
  local_1198[0xe] = '\0';
  local_1198[0xf] = '\0';
  local_1198[0] = '\0';
  local_1198[1] = '\0';
  local_1198[2] = '\0';
  local_1198[3] = '\0';
  local_1198[4] = '\0';
  local_1198[5] = '\0';
  local_1198[6] = '\0';
  local_1198[7] = '\0';
  local_13a1 = '\0';
  local_1358 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_1358);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  pCVar58 = this;
  if (sVar5 != 0) {
    pSVar33 = (SPIRType *)
              (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_13a0 = (SPIRType *)((long)(&(pSVar33->array).stack_storage + -2) + 8 + sVar5 * 4);
    local_11b0 = &this->constexpr_samplers_by_id;
    local_11b8 = (key_type)&(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_11a8 = &(this->inline_uniform_blocks)._M_h;
    local_1360 = &(this->atomic_image_vars)._M_h;
    local_11a0 = &(this->buffers_requiring_array_length)._M_h;
    do {
      IVar26.id = *(uint32_t *)&(pSVar33->super_IVariant)._vptr_IVariant;
      pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar6[IVar26.id].type == TypeVariable) {
        this = pCVar58;
        kVar28 = (key_type)Variant::get<spirv_cross::SPIRVariable>(pVVar6 + IVar26.id);
        pCVar58 = this;
        if ((*(StorageClass *)((long)kVar28 + 0x10) < (StorageClassStorageBuffer|StorageClassInput))
           && ((0x1005U >> (*(StorageClass *)((long)kVar28 + 0x10) & 0x1f) & 1) != 0)) {
          bVar21 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)kVar28,false);
          pCVar58 = this;
          if (!bVar21) {
            uVar22 = Compiler::get_decoration((Compiler *)this,IVar26,DecorationDescriptorSet);
            local_1378 = (Resource *)CONCAT44(local_1378._4_4_,uVar22);
            pCVar58 = this;
            if (((uVar22 < 8) && ((this->msl_options).argument_buffers != false)) &&
               ((this->argument_buffer_discrete_mask >> (uVar22 & 0x1f) & 1) == 0)) {
              uVar22 = ((ID *)((long)kVar28 + 8))->id;
              local_1398.desc_set = uVar22;
              local_1380 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)kVar28)
              ;
              if (*(int *)&(local_1380->super_IVariant).field_0xc - 0x11U < 2) {
                local_1368 = find_constexpr_sampler(this,uVar22);
                if (local_1368 == (MSLConstexprSampler *)0x0) goto LAB_002a9f61;
                pmVar29 = ::std::
                          map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                          ::operator[](local_11b0,&local_1398.desc_set);
                pMVar49 = local_1368;
                for (lVar27 = 0x19; lVar27 != 0; lVar27 = lVar27 + -1) {
                  pmVar29->coord = pMVar49->coord;
                  pMVar49 = (MSLConstexprSampler *)((long)pMVar49 + (ulong)bVar57 * -8 + 4);
                  pmVar29 = (mapped_type *)((long)pmVar29 + (ulong)bVar57 * -8 + 4);
                }
              }
              else {
LAB_002a9f61:
                local_1368 = (MSLConstexprSampler *)0x0;
              }
              if ((*(StorageClass *)((long)kVar28 + 0x10) == StorageClassStorageBuffer) ||
                 (*(StorageClass *)((long)kVar28 + 0x10) == StorageClassUniform)) {
                sVar5 = local_10f8[(ulong)local_1378 & 0xffffffff].super_VectorView<Resource>.
                        buffer_size;
                if (sVar5 == 0) goto LAB_002aa027;
                pRVar56 = local_10f8[(ulong)local_1378 & 0xffffffff].super_VectorView<Resource>.ptr;
                lVar27 = 0;
                pCVar58 = this;
                do {
                  this = pCVar58;
                  uVar22 = Compiler::get_decoration
                                     ((Compiler *)pCVar58,
                                      (ID)*(uint32_t *)(*(long *)((long)&pRVar56->var + lVar27) + 8)
                                      ,DecorationBinding);
                  uVar23 = Compiler::get_decoration
                                     ((Compiler *)pCVar58,(ID)local_1398.desc_set,DecorationBinding)
                  ;
                  if (((uVar22 == uVar23) && (*(int *)((long)&pRVar56->basetype + lVar27) == 0xf))
                     && (*(int *)&(local_1380->super_IVariant).field_0xc == 0xf)) {
                    pSVar7 = *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> **)
                              ((long)&pRVar56->var + lVar27);
                    iVar3 = (int)pSVar7->buffer_capacity;
                    if ((iVar3 == 0xc) || (iVar3 == 2)) {
                      *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> **)
                       ((long)&pRVar56->descriptor_alias + lVar27) = pSVar7;
                      local_1390 = pSVar7;
                      cVar41 = ::std::
                               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                       *)local_11b8,&local_1398.desc_set);
                      if (cVar41.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                          (__node_type *)0x0) {
                        local_1350._0_4_ =
                             *(uint32_t *)(*(long *)((long)&pRVar56->var + lVar27) + 8);
                        local_1308._0_4_ = local_11b8.desc_set;
                        local_1308._4_4_ = local_11b8.binding;
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)local_11b8,(ID *)local_1350,local_1308);
                      }
                      goto LAB_002aa08e;
                    }
                  }
                  lVar27 = lVar27 + 0x40;
                  pCVar58 = this;
                } while (sVar5 << 6 != lVar27);
                local_1390 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)0x0;
              }
              else {
LAB_002aa027:
                local_1390 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)0x0;
              }
LAB_002aa08e:
              uVar22 = Compiler::get_decoration
                                 ((Compiler *)this,(ID)local_1398.desc_set,DecorationBinding);
              if (*(int *)&(local_1380->super_IVariant).field_0xc == 0x11) {
                CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1398.desc_set);
                uVar22 = 1;
                if (((local_1368 == (MSLConstexprSampler *)0x0) ||
                    (local_1368->ycbcr_conversion_enable != true)) ||
                   (uVar22 = local_1368->planes, _Var11._M_p = local_12f8._M_dataplus._M_p,
                   uVar22 != 0)) {
                  uVar30 = (ulong)local_1378 & 0xffffffff;
                  uVar23 = 0;
                  pCVar58 = this;
                  do {
                    this = pCVar58;
                    uVar24 = get_metal_resource_index(pCVar58,(SPIRVariable *)kVar28,Image,uVar23);
                    local_1308._8_4_ = SUB84(local_1390,0);
                    local_1308._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                    local_1308._0_8_ = kVar28;
                    (*(pCVar58->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                              (&local_12f8,pCVar58,(ulong)local_1398.desc_set);
                    local_12d8 = CONCAT44(uVar24,Image);
                    local_12d0[0] = uVar23;
                    SmallVector<Resource,_8UL>::push_back
                              (local_10f8 + uVar30,(Resource *)local_1308);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
                      operator_delete(local_12f8._M_dataplus._M_p);
                    }
                    uVar23 = uVar23 + 1;
                    pCVar58 = this;
                  } while (uVar22 != uVar23);
                  _Var11._M_p = local_12f8._M_dataplus._M_p;
                  if ((local_1368 == (MSLConstexprSampler *)0x0) &&
                     ((local_1380->image).dim != DimBuffer)) {
                    uVar22 = get_metal_resource_index(this,(SPIRVariable *)kVar28,Sampler,0);
                    local_1308._8_4_ = SUB84(local_1390,0);
                    local_1308._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                    local_1308._0_8_ = kVar28;
                    to_sampler_expression_abi_cxx11_(&local_12f8,this,local_1398.desc_set);
                    local_12d8 = CONCAT44(uVar22,Sampler);
                    local_12d0[0] = 0;
                    SmallVector<Resource,_8UL>::push_back
                              (local_10f8 + uVar30,(Resource *)local_1308);
                    psVar46 = &local_12f8;
                    _Var11._M_p = local_12f8._M_dataplus._M_p;
LAB_002aa231:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_12f8._M_dataplus._M_p != &psVar46->field_2) {
                      operator_delete(local_12f8._M_dataplus._M_p);
                      local_12f8._M_dataplus._M_p = _Var11._M_p;
                      _Var11._M_p = local_12f8._M_dataplus._M_p;
                    }
                  }
                }
              }
              else {
                local_1308._4_4_ = uVar22;
                local_1308._0_4_ = (uint32_t)local_1378;
                cVar40 = ::std::
                         _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(local_11a8,(key_type *)local_1308);
                if (cVar40.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur ==
                    (__node_type *)0x0) {
                  _Var11._M_p = local_12f8._M_dataplus._M_p;
                  if (local_1368 == (MSLConstexprSampler *)0x0) {
                    bVar21 = is_supported_argument_buffer_type(this,local_1380);
                    _Var11._M_p = local_12f8._M_dataplus._M_p;
                    if (bVar21) {
                      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1398.desc_set)
                      ;
                      uVar22 = 0xffffffff;
                      if (local_1390 ==
                          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)0x0) {
                        uVar22 = get_metal_resource_index
                                           (this,(SPIRVariable *)kVar28,
                                            *(BaseType *)&(local_1380->super_IVariant).field_0xc,0);
                      }
                      local_1308._8_4_ = SUB84(local_1390,0);
                      local_1308._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                      local_1308._0_8_ = kVar28;
                      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                (&local_12f8,this,(ulong)local_1398.desc_set);
                      uVar30 = (ulong)local_1378 & 0xffffffff;
                      local_12d8 = CONCAT44(uVar22,*(BaseType *)
                                                    &(local_1380->super_IVariant).field_0xc);
                      local_12d0[0] = 0;
                      SmallVector<Resource,_8UL>::push_back
                                (local_10f8 + uVar30,(Resource *)local_1308);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
                        operator_delete(local_12f8._M_dataplus._M_p);
                      }
                      local_1308._0_4_ = ((ID *)((long)kVar28 + 8))->id;
                      cVar41 = ::std::
                               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               ::find(local_1360,(key_type *)local_1308);
                      _Var11._M_p = local_12f8._M_dataplus._M_p;
                      if (cVar41.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                          (__node_type *)0x0) {
                        uVar22 = get_metal_resource_index
                                           (this,(SPIRVariable *)kVar28,AtomicCounter,0);
                        local_1308._8_4_ = SUB84(local_1390,0);
                        local_1308._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                        local_1308._0_8_ = kVar28;
                        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                  ((ID *)local_1350,this,(ulong)local_1398.desc_set,1);
                        plVar31 = (long *)::std::__cxx11::string::append((char *)local_1350);
                        paVar45 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(plVar31 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar31 == paVar45) {
                          local_12f8.field_2._M_allocated_capacity = paVar45->_M_allocated_capacity;
                          local_12f8.field_2._8_8_ = plVar31[3];
                          local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
                        }
                        else {
                          local_12f8.field_2._M_allocated_capacity = paVar45->_M_allocated_capacity;
                          local_12f8._M_dataplus._M_p = (pointer)*plVar31;
                        }
                        local_12f8._M_string_length = plVar31[1];
                        *plVar31 = (long)paVar45;
                        plVar31[1] = 0;
                        *(undefined1 *)(plVar31 + 2) = 0;
                        local_12d8 = CONCAT44(uVar22,Struct);
                        local_12d0[0] = 0;
                        SmallVector<Resource,_8UL>::push_back
                                  (local_10f8 + uVar30,(Resource *)local_1308);
                        _Var11._M_p = local_12f8._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
                          operator_delete(local_12f8._M_dataplus._M_p);
                          _Var11._M_p = local_12f8._M_dataplus._M_p;
                        }
                        local_12f8._M_dataplus._M_p =
                             (pointer)CONCAT44(local_1350._4_4_,local_1350._0_4_);
                        psVar46 = (string *)local_1350;
                        goto LAB_002aa231;
                      }
                    }
                  }
                }
                else {
                  SmallVector<unsigned_int,_8UL>::reserve
                            ((SmallVector<unsigned_int,_8UL> *)local_1170,local_1170._8_8_ + 1);
                  *(uint32_t *)
                   ((long)(&((SmallVector<unsigned_int,_8UL> *)(local_1170._0_8_ + 0x20))->
                            stack_storage + -2) + 8 + local_1170._8_8_ * 4) = local_1398.desc_set;
                  local_1170._8_8_ = local_1170._8_8_ + 1;
                  _Var11._M_p = local_12f8._M_dataplus._M_p;
                }
              }
              local_12f8._M_dataplus._M_p = _Var11._M_p;
              if (this->needs_swizzle_buffer_def == true) {
                bVar21 = Compiler::is_sampled_image_type((Compiler *)this,local_1380);
                if (!bVar21) goto LAB_002aa479;
                pcVar32 = local_1198 + ((ulong)local_1378 & 0xffffffff) + 8;
              }
              else {
LAB_002aa479:
                local_1308._0_4_ = local_1398.desc_set;
                cVar41 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(local_11a0,(key_type *)local_1308);
                pCVar58 = this;
                if (cVar41.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                    (__node_type *)0x0) goto LAB_002aa4b6;
                local_1198[(ulong)local_1378 & 0xffffffff] = '\x01';
                pcVar32 = &local_13a1;
              }
              *pcVar32 = '\x01';
              pCVar58 = this;
            }
          }
        }
      }
LAB_002aa4b6:
      pSVar33 = (SPIRType *)((long)&(pSVar33->super_IVariant)._vptr_IVariant + 4);
    } while (pSVar33 != local_13a0);
  }
  ParsedIR::LoopLock::~LoopLock(local_1328);
  if ((this->needs_swizzle_buffer_def != false) || (local_13a1 == '\x01')) {
    local_1350._0_4_ = 0;
    this_00 = local_10f8;
    lVar27 = 0;
    do {
      cVar2 = local_1198[lVar27 + 8];
      if ((cVar2 != '\0') || (local_1198[lVar27] == '\x01')) {
        if (local_1350._0_4_ == 0) {
          local_1350._0_4_ = ParsedIR::increase_bound_by(local_1358,1);
          uVar22 = get_uint_type_id(pCVar58);
          pSVar33 = Variant::get<spirv_cross::SPIRType>
                              ((pCVar58->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar22);
          SPIRType::SPIRType((SPIRType *)local_1308,pSVar33);
          local_128c._0_1_ = true;
          local_1290 = local_1290 + 1;
          pCVar51 = pCVar58;
          TVar25.id = get_uint_type_id(pCVar58);
          local_11f8._4_4_ = TVar25.id;
          local_1288 = StorageClassUniform;
          Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                    ((Compiler *)pCVar58,local_1350._0_4_,(SPIRType *)local_1308);
          Compiler::set_decoration((Compiler *)pCVar58,(ID)local_1350._0_4_,DecorationArrayStride,4)
          ;
          local_1308._0_8_ = &PTR__SPIRType_003f9270;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_11f0);
          local_1240 = 0;
          pCVar58 = pCVar51;
          if (local_1248 != local_1230) {
            free(local_1248);
            pCVar58 = pCVar51;
          }
          local_1278 = 0;
          if (local_1280 != local_1268) {
            free(local_1280);
          }
          local_12a8 = 0;
          if (local_12b0 != local_1298) {
            free(local_12b0);
          }
          local_12f8.field_2._8_8_ = 0;
          if ((uint *)local_12f8.field_2._M_allocated_capacity != local_12d0) {
            free((void *)local_12f8.field_2._M_allocated_capacity);
          }
        }
        if (cVar2 != '\0') {
          IVar26.id = ParsedIR::increase_bound_by(local_1358,1);
          local_1308._0_8_ = local_1308._0_8_ & 0xffffffff00000000;
          kVar28 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)pCVar58,IVar26.id,(uint *)local_1350,
                              (StorageClass *)local_1308);
          local_1308._0_8_ = &local_12f8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1308,"spvSwizzleConstants","");
          Compiler::set_name((Compiler *)pCVar58,IVar26,(string *)local_1308);
          pCVar51 = pCVar58;
          if ((string *)local_1308._0_8_ != &local_12f8) {
            operator_delete((void *)local_1308._0_8_);
            pCVar51 = pCVar58;
          }
          pCVar58 = pCVar51;
          Compiler::set_decoration
                    ((Compiler *)pCVar51,IVar26,DecorationDescriptorSet,(uint32_t)lVar27);
          Compiler::set_decoration((Compiler *)pCVar51,IVar26,DecorationBinding,0xfffffffe);
          local_1308._8_4_ = 0;
          local_1308._12_4_ = 0;
          local_1308._0_8_ = kVar28;
          (*(pCVar51->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_12f8,pCVar51,(ulong)IVar26.id);
          local_12d8 = CONCAT44(local_12d8._4_4_,UInt);
          uVar22 = get_metal_resource_index(pCVar51,(SPIRVariable *)kVar28,UInt,0);
          local_12d8 = CONCAT44(uVar22,(BaseType)local_12d8);
          local_12d0[0] = 0;
          SmallVector<Resource,_8UL>::push_back(this_00,(Resource *)local_1308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
            operator_delete(local_12f8._M_dataplus._M_p);
          }
        }
        if (local_1198[lVar27] == '\x01') {
          IVar26.id = ParsedIR::increase_bound_by(local_1358,1);
          local_1308._0_8_ = local_1308._0_8_ & 0xffffffff00000000;
          kVar28 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)pCVar58,IVar26.id,(uint *)local_1350,
                              (StorageClass *)local_1308);
          local_1308._0_8_ = &local_12f8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1308,"spvBufferSizeConstants","");
          Compiler::set_name((Compiler *)pCVar58,IVar26,(string *)local_1308);
          pCVar51 = pCVar58;
          if ((string *)local_1308._0_8_ != &local_12f8) {
            operator_delete((void *)local_1308._0_8_);
            pCVar51 = pCVar58;
          }
          pCVar58 = pCVar51;
          Compiler::set_decoration
                    ((Compiler *)pCVar51,IVar26,DecorationDescriptorSet,(uint32_t)lVar27);
          Compiler::set_decoration((Compiler *)pCVar51,IVar26,DecorationBinding,0xfffffffd);
          local_1308._8_4_ = 0;
          local_1308._12_4_ = 0;
          local_1308._0_8_ = kVar28;
          (*(pCVar51->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_12f8,pCVar51,(ulong)IVar26.id);
          local_12d8 = CONCAT44(local_12d8._4_4_,UInt);
          uVar22 = get_metal_resource_index(pCVar51,(SPIRVariable *)kVar28,UInt,0);
          local_12d8 = CONCAT44(uVar22,(BaseType)local_12d8);
          local_12d0[0] = 0;
          SmallVector<Resource,_8UL>::push_back(this_00,(Resource *)local_1308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
            operator_delete(local_12f8._M_dataplus._M_p);
          }
        }
      }
      lVar27 = lVar27 + 1;
      this_00 = this_00 + 1;
    } while (lVar27 != 8);
  }
  pCVar51 = pCVar58;
  if (local_1170._8_8_ != 0) {
    local_13a0 = (SPIRType *)local_1170._0_8_;
    lVar27 = local_1170._8_8_ << 2;
    lVar54 = 0;
    do {
      IVar26.id = *(uint32_t *)((long)(&(local_13a0->array).stack_storage + -2) + 8 + lVar54);
      kVar28 = (key_type)
               Variant::get<spirv_cross::SPIRVariable>
                         ((pCVar58->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + IVar26.id);
      uVar22 = Compiler::get_decoration((Compiler *)pCVar58,IVar26,DecorationDescriptorSet);
      CompilerGLSL::add_resource_name(&pCVar58->super_CompilerGLSL,IVar26.id);
      local_1308._8_4_ = 0;
      local_1308._12_4_ = 0;
      local_1308._0_8_ = kVar28;
      (*(pCVar58->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_12f8,pCVar58,(ulong)IVar26.id);
      local_12d8 = CONCAT44(local_12d8._4_4_,Struct);
      uVar23 = get_metal_resource_index(pCVar58,(SPIRVariable *)kVar28,Struct,0);
      local_12d8 = CONCAT44(uVar23,(BaseType)local_12d8);
      local_12d0[0] = 0;
      SmallVector<Resource,_8UL>::push_back(local_10f8 + uVar22,(Resource *)local_1308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
        operator_delete(local_12f8._M_dataplus._M_p);
      }
      lVar54 = lVar54 + 4;
    } while (lVar27 != lVar54);
  }
  local_1384 = 0;
  local_1368 = (MSLConstexprSampler *)&pCVar51->plane_name_suffix;
  local_11b0 = (map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                *)&pCVar51->buffers_requiring_dynamic_offset;
  local_11b8 = (key_type)
               &(pCVar51->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header;
  local_1178 = &(pCVar51->inline_uniform_blocks)._M_h;
  local_1180 = &(pCVar51->atomic_image_vars)._M_h;
  local_1188 = &pCVar51->buffer_aliases_argument;
  pCVar58 = pCVar51;
  do {
    uVar30 = (ulong)local_1384;
    if (local_10f8[uVar30].super_VectorView<Resource>.buffer_size != 0) {
      if (((pCVar51->msl_options).argument_buffers != true) ||
         ((pCVar51->argument_buffer_discrete_mask >> (local_1384 & 0x1f) & 1) != 0)) {
        __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x43c9,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
      }
      IVar26.id = ParsedIR::increase_bound_by(local_1358,3);
      id.id = IVar26.id + 1;
      local_132c = IVar26.id + 2;
      pCVar51->argument_buffer_ids[local_1384] = IVar26.id;
      local_13a0 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar51,id.id);
      *(undefined4 *)&(local_13a0->super_IVariant).field_0xc = 0xf;
      ts_1 = (uint *)(ulong)local_1384;
      if ((pCVar51->argument_buffer_device_storage_mask >> (local_1384 & 0x1f) & 1) == 0) {
        local_13a0->storage = StorageClassUniform;
      }
      else {
        local_13a0->storage = StorageClassStorageBuffer;
        Compiler::set_decoration((Compiler *)pCVar51,IVar26,DecorationNonWritable,0);
        ts_1 = (uint *)0x0;
        Compiler::set_decoration((Compiler *)pCVar51,id,DecorationBlock,0);
      }
      join<char_const(&)[23],unsigned_int&>
                ((string *)local_1308,(spirv_cross *)"spvDescriptorSetBuffer",
                 (char (*) [23])&local_1384,ts_1);
      Compiler::set_name((Compiler *)pCVar51,id,(string *)local_1308);
      if ((string *)local_1308._0_8_ != &local_12f8) {
        operator_delete((void *)local_1308._0_8_);
      }
      pSVar34 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar51,local_132c);
      pSVar33 = local_13a0;
      (pSVar34->super_IVariant).self.id = (local_13a0->super_IVariant).self.id;
      uVar22 = local_13a0->vecsize;
      uVar23 = local_13a0->columns;
      *(undefined8 *)&(pSVar34->super_IVariant).field_0xc =
           *(undefined8 *)&(local_13a0->super_IVariant).field_0xc;
      pSVar34->vecsize = uVar22;
      pSVar34->columns = uVar23;
      SmallVector<unsigned_int,_8UL>::operator=(&pSVar34->array,&local_13a0->array);
      SmallVector<bool,_8UL>::operator=(&pSVar34->array_size_literal,&pSVar33->array_size_literal);
      bVar21 = pSVar33->pointer;
      bVar12 = pSVar33->forward_pointer;
      uVar13 = *(undefined2 *)&pSVar33->field_0x7e;
      pSVar34->pointer_depth = pSVar33->pointer_depth;
      pSVar34->pointer = bVar21;
      pSVar34->forward_pointer = bVar12;
      *(undefined2 *)&pSVar34->field_0x7e = uVar13;
      pSVar34->storage = pSVar33->storage;
      local_1390 = &pSVar33->member_types;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                (&pSVar34->member_types,local_1390);
      SmallVector<unsigned_int,_8UL>::operator=
                (&pSVar34->member_type_index_redirection,&pSVar33->member_type_index_redirection);
      DVar14 = (pSVar33->image).dim;
      bVar21 = (pSVar33->image).depth;
      bVar12 = (pSVar33->image).arrayed;
      bVar15 = (pSVar33->image).ms;
      uVar16 = (pSVar33->image).field_0xb;
      uVar22 = (pSVar33->image).sampled;
      IVar17 = (pSVar33->image).format;
      AVar18 = (pSVar33->image).access;
      TVar25.id = (pSVar33->type_alias).id;
      TVar19.id = (pSVar33->parent_type).id;
      (pSVar34->image).type = (TypeID)(pSVar33->image).type.id;
      (pSVar34->image).dim = DVar14;
      (pSVar34->image).depth = bVar21;
      (pSVar34->image).arrayed = bVar12;
      (pSVar34->image).ms = bVar15;
      (pSVar34->image).field_0xb = uVar16;
      (pSVar34->image).sampled = uVar22;
      (pSVar34->image).format = IVar17;
      (pSVar34->image).access = AVar18;
      pSVar34->type_alias = (TypeID)TVar25.id;
      pSVar34->parent_type = (TypeID)TVar19.id;
      if (pSVar33 != pSVar34) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pSVar34->member_name_cache,&(local_13a0->member_name_cache)._M_h);
      }
      pSVar34->pointer = true;
      pSVar34->pointer_depth = pSVar34->pointer_depth + 1;
      (pSVar34->parent_type).id = id.id;
      local_1308._0_4_ = 2;
      psVar46 = (string *)local_1308;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                ((Compiler *)pCVar51,IVar26.id,&local_132c,(StorageClass *)local_1308);
      join<char_const(&)[17],unsigned_int&>
                ((string *)local_1308,(spirv_cross *)"spvDescriptorSet",(char (*) [17])&local_1384,
                 (uint *)psVar46);
      Compiler::set_name((Compiler *)pCVar51,IVar26,(string *)local_1308);
      pCVar51 = pCVar58;
      if ((string *)local_1308._0_8_ != &local_12f8) {
        operator_delete((void *)local_1308._0_8_);
        pCVar51 = pCVar58;
      }
      pRVar56 = local_10f8[uVar30].super_VectorView<Resource>.ptr;
      sVar5 = local_10f8[uVar30].super_VectorView<Resource>.buffer_size;
      pCVar58 = pCVar51;
      if (sVar5 != 0) {
        sVar50 = sVar5;
        local_1360 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(ulong)IVar26.id;
        if (0 < (long)sVar5) {
LAB_002aad39:
          uVar52 = sVar50 + 1 >> 1;
          puVar35 = (undefined8 *)operator_new(uVar52 << 6,(nothrow_t *)&::std::nothrow);
          if (puVar35 == (undefined8 *)0x0) break;
          pSVar8 = pRVar56->descriptor_alias;
          *puVar35 = pRVar56->var;
          puVar35[1] = pSVar8;
          psVar48 = puVar35 + 4;
          puVar35[2] = psVar48;
          pcVar9 = (pRVar56->name)._M_dataplus._M_p;
          paVar45 = &(pRVar56->name).field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar9 == paVar45) {
            uVar10 = *(undefined8 *)((long)&(pRVar56->name).field_2 + 8);
            *psVar48 = paVar45->_M_allocated_capacity;
            puVar35[5] = uVar10;
          }
          else {
            puVar35[2] = pcVar9;
            puVar35[4] = paVar45->_M_allocated_capacity;
          }
          puVar35[3] = (pRVar56->name)._M_string_length;
          (pRVar56->name)._M_dataplus._M_p = (pointer)paVar45;
          (pRVar56->name)._M_string_length = 0;
          (pRVar56->name).field_2._M_local_buf[0] = '\0';
          *(uint32_t *)(puVar35 + 7) = pRVar56->plane;
          puVar35[6] = *(undefined8 *)&pRVar56->basetype;
          puVar55 = puVar35;
          if (uVar52 != 1) {
            lVar27 = (sVar50 * 0x20 + 0x20 & 0xffffffffffffffc0) - 0x40;
            puVar20 = puVar35 + 0xc;
            do {
              puVar55 = puVar20;
              puVar55[-4] = puVar55[-0xc];
              puVar55[-3] = puVar55[-0xb];
              puVar55[-2] = puVar55;
              puVar20 = puVar55 + -8;
              if (puVar20 == (undefined8 *)puVar55[-10]) {
                *puVar55 = *puVar20;
                puVar55[1] = puVar55[-7];
              }
              else {
                puVar55[-2] = (undefined8 *)puVar55[-10];
                *puVar55 = puVar55[-8];
              }
              puVar55[-1] = puVar55[-9];
              puVar55[-10] = puVar20;
              puVar55[-9] = 0;
              *(undefined1 *)(puVar55 + -8) = 0;
              puVar55[2] = puVar55[-6];
              *(undefined4 *)(puVar55 + 3) = *(undefined4 *)(puVar55 + -5);
              lVar27 = lVar27 + -0x40;
              puVar20 = puVar55 + 8;
            } while (lVar27 != 0);
            puVar55 = puVar55 + -4;
          }
          local_1380 = (SPIRType *)&pRVar56->basetype;
          pSVar8 = (SPIRVariable *)puVar55[1];
          pRVar56->var = (SPIRVariable *)*puVar55;
          pRVar56->descriptor_alias = pSVar8;
          local_1378 = pRVar56;
          ::std::__cxx11::string::operator=((string *)&pRVar56->name,(string *)(puVar55 + 2));
          (local_1380->super_IVariant)._vptr_IVariant = (_func_int **)puVar55[6];
          (local_1380->super_IVariant).self.id = *(uint32_t *)(puVar55 + 7);
          ::std::
          __stable_sort_adaptive<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                    (local_1378,pRVar56 + sVar5,puVar35,uVar52);
          uVar52 = sVar50 * 0x20 + 0x20 & 0xffffffffffffffc0;
          do {
            if (psVar48 != (size_type *)psVar48[-2]) {
              operator_delete((size_type *)psVar48[-2]);
            }
            psVar48 = psVar48 + 8;
            uVar52 = uVar52 - 0x40;
          } while (uVar52 != 0);
          goto LAB_002aaef0;
        }
LAB_002aad61:
        ::std::
        __inplace_stable_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                  (pRVar56,pRVar56 + sVar5);
        puVar35 = (undefined8 *)0x0;
LAB_002aaef0:
        operator_delete(puVar35);
        pRVar56 = local_10f8[uVar30].super_VectorView<Resource>.ptr;
        sVar5 = local_10f8[uVar30].super_VectorView<Resource>.buffer_size;
        local_136c = 0;
        local_1388 = 0;
        pCVar58 = pCVar51;
        if (sVar5 != 0) {
          local_1380 = (SPIRType *)&pRVar56[sVar5].var;
          do {
            pSVar8 = pRVar56->var;
            pSVar33 = Compiler::get_variable_data_type((Compiler *)pCVar51,pSVar8);
            if ((pCVar51->msl_options).pad_argument_buffer_resources == true) {
              if (pRVar56->descriptor_alias == (SPIRVariable *)0x0) {
LAB_002aafd0:
                do {
                  if (pRVar56->index <= local_1388) break;
                  rez_bind = get_argument_buffer_resource(pCVar51,local_1384,local_1388);
                  BVar4 = rez_bind->basetype;
                  if (0xd < BVar4 - Void) {
                    if (BVar4 == Image) {
LAB_002aafb8:
                      add_argument_buffer_padding_image_type
                                (pCVar51,local_13a0,&local_136c,&local_1388,rez_bind);
                      in_R8 = rez_bind;
                      goto LAB_002aafd0;
                    }
                    if (BVar4 == SampledImage) {
                      if (local_1388 != rez_bind->msl_sampler) goto LAB_002aafb8;
                    }
                    else if (BVar4 != Sampler) goto LAB_002aafd0;
                    add_argument_buffer_padding_sampler_type
                              (pCVar51,local_13a0,&local_136c,&local_1388,rez_bind);
                    in_R8 = rez_bind;
                    goto LAB_002aafd0;
                  }
                  add_argument_buffer_padding_buffer_type
                            (pCVar51,local_13a0,&local_136c,&local_1388,rez_bind);
                  in_R8 = rez_bind;
                } while( true );
              }
              if ((pSVar33->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                uVar22 = 1;
              }
              else {
                uVar22 = CompilerGLSL::to_array_size_literal(&pCVar51->super_CompilerGLSL,pSVar33);
                if (uVar22 == 0) {
                  uVar22 = get_resource_array_size(pCVar51,(pSVar8->super_IVariant).self.id);
                }
              }
              local_1388 = local_1388 + uVar22;
            }
            local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
            pcVar9 = (pRVar56->name)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1118,pcVar9,pcVar9 + (pRVar56->name)._M_string_length);
            local_1138._M_dataplus._M_p = (pointer)&local_1138.field_2;
            psVar46 = &local_1138;
            this_01 = (CompilerMSL *)0x376eff;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar46,"m","");
            ensure_valid_name((string *)local_1350,this_01,&local_1118,psVar46);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
              operator_delete(local_1138._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
              operator_delete(local_1118._M_dataplus._M_p);
            }
            if (pRVar56->plane != 0) {
              join<std::__cxx11::string&,unsigned_int&>
                        ((string *)local_1308,(spirv_cross *)local_1368,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pRVar56->plane,(uint *)psVar46);
              ::std::__cxx11::string::_M_append((char *)local_1350,local_1308._0_8_);
              if ((string *)local_1308._0_8_ != &local_12f8) {
                operator_delete((void *)local_1308._0_8_);
              }
            }
            uVar22 = local_136c;
            Compiler::set_member_name
                      ((Compiler *)pCVar51,(TypeID)(local_13a0->super_IVariant).self.id,local_136c,
                       (string *)local_1350);
            local_1378 = (Resource *)CONCAT44(local_1378._4_4_,uVar22);
            if ((pRVar56->basetype == Sampler) &&
               (*(int *)&(pSVar33->super_IVariant).field_0xc != 0x12)) {
              sVar5 = (pSVar33->array).super_VectorView<unsigned_int>.buffer_size;
              uVar22 = ParsedIR::increase_bound_by(local_1358,2 - (sVar5 == 0));
              pSVar36 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar51,uVar22);
              pSVar34 = local_13a0;
              *(undefined4 *)&(pSVar36->super_IVariant).field_0xc = 0x12;
              pSVar36->storage = StorageClassUniformConstant;
              if (sVar5 == 0) {
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1390,
                           (local_13a0->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar5 = (pSVar34->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar34->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar5].id =
                     uVar22;
                (pSVar34->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar5 + 1;
              }
              else {
                pSVar37 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar51,uVar22 + 1);
                (pSVar37->super_IVariant).self.id = (pSVar36->super_IVariant).self.id;
                uVar23 = pSVar36->vecsize;
                uVar24 = pSVar36->columns;
                *(undefined8 *)&(pSVar37->super_IVariant).field_0xc =
                     *(undefined8 *)&(pSVar36->super_IVariant).field_0xc;
                pSVar37->vecsize = uVar23;
                pSVar37->columns = uVar24;
                local_11a0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)&pSVar37->array;
                SmallVector<unsigned_int,_8UL>::operator=
                          ((SmallVector<unsigned_int,_8UL> *)local_11a0,&pSVar36->array);
                local_11a8 = (_Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)&pSVar37->array_size_literal;
                SmallVector<bool,_8UL>::operator=
                          ((SmallVector<bool,_8UL> *)local_11a8,&pSVar36->array_size_literal);
                bVar21 = pSVar36->pointer;
                bVar12 = pSVar36->forward_pointer;
                uVar13 = *(undefined2 *)&pSVar36->field_0x7e;
                pSVar37->pointer_depth = pSVar36->pointer_depth;
                pSVar37->pointer = bVar21;
                pSVar37->forward_pointer = bVar12;
                *(undefined2 *)&pSVar37->field_0x7e = uVar13;
                pSVar37->storage = pSVar36->storage;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                          (&pSVar37->member_types,&pSVar36->member_types);
                SmallVector<unsigned_int,_8UL>::operator=
                          (&pSVar37->member_type_index_redirection,
                           &pSVar36->member_type_index_redirection);
                DVar14 = (pSVar36->image).dim;
                bVar21 = (pSVar36->image).depth;
                bVar12 = (pSVar36->image).arrayed;
                bVar15 = (pSVar36->image).ms;
                uVar16 = (pSVar36->image).field_0xb;
                uVar23 = (pSVar36->image).sampled;
                IVar17 = (pSVar36->image).format;
                AVar18 = (pSVar36->image).access;
                TVar25.id = (pSVar36->type_alias).id;
                TVar19.id = (pSVar36->parent_type).id;
                (pSVar37->image).type = (TypeID)(pSVar36->image).type.id;
                (pSVar37->image).dim = DVar14;
                (pSVar37->image).depth = bVar21;
                (pSVar37->image).arrayed = bVar12;
                (pSVar37->image).ms = bVar15;
                (pSVar37->image).field_0xb = uVar16;
                (pSVar37->image).sampled = uVar23;
                (pSVar37->image).format = IVar17;
                (pSVar37->image).access = AVar18;
                pSVar37->type_alias = (TypeID)TVar25.id;
                pSVar37->parent_type = (TypeID)TVar19.id;
                pCVar51 = pCVar58;
                if (pSVar36 != pSVar37) {
                  ::std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&pSVar37->member_name_cache,&(pSVar36->member_name_cache)._M_h);
                  pCVar51 = pCVar58;
                }
                SmallVector<unsigned_int,_8UL>::operator=
                          ((SmallVector<unsigned_int,_8UL> *)local_11a0,&pSVar33->array);
                SmallVector<bool,_8UL>::operator=
                          ((SmallVector<bool,_8UL> *)local_11a8,&pSVar33->array_size_literal);
                pSVar34 = local_13a0;
                (pSVar37->parent_type).id = uVar22;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1390,
                           (local_13a0->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar5 = (pSVar34->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar34->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar5].id =
                     uVar22 + 1;
                (pSVar34->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar5 + 1;
                pCVar58 = pCVar51;
              }
            }
            else {
              local_1398.binding =
                   Compiler::get_decoration
                             ((Compiler *)pCVar51,(ID)(pSVar8->super_IVariant).self.id,
                              DecorationBinding);
              local_1398.desc_set = local_1384;
              if (pRVar56->basetype - Image < 3) {
                uVar22 = Compiler::get_variable_data_type_id((Compiler *)pCVar51,pSVar8);
                pSVar33 = local_13a0;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1390,
                           (local_13a0->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar5 = (pSVar33->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar33->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar5].id =
                     uVar22;
                (pSVar33->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar5 + 1;
                pSVar34 = local_13a0;
                if (pRVar56->plane != 0) goto LAB_002ab544;
                uVar22 = (pSVar8->super_IVariant).self.id;
                (*(pCVar51->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          ((spirv_cross *)local_1328,pCVar51,local_1360,1);
                join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                          ((string *)local_1308,(spirv_cross *)local_1328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x36210b,(char (*) [2])local_1350,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_R8);
                Compiler::set_qualified_name((Compiler *)pCVar51,uVar22,(string *)local_1308);
              }
              else {
                cVar38 = ::std::
                         _Rb_tree<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                         ::find((_Rb_tree<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                 *)local_11b0,&local_1398);
                pSVar34 = local_13a0;
                if ((key_type)cVar38._M_node != local_11b8) {
                  if (pRVar56->descriptor_alias != (SPIRVariable *)0x0) {
                    prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_1308._0_8_ = &local_12f8;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1308,
                               "Descriptor aliasing is currently not supported with dynamic offsets."
                               ,"");
                    ::std::runtime_error::runtime_error(prVar43,(string *)local_1308);
                    *(undefined ***)prVar43 = &PTR__runtime_error_003f8e68;
                    __cxa_throw(prVar43,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                            (local_1390,
                             (local_13a0->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size + 1);
                  sVar5 = (pSVar34->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                  ;
                  (pSVar34->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar5].id =
                       *(uint32_t *)&(pSVar8->super_IVariant).field_0xc;
                  (pSVar34->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                       sVar5 + 1;
                  uVar22 = (pSVar8->super_IVariant).self.id;
                  pmVar39 = ::std::
                            map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                            ::operator[]((map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                          *)local_11b0,&local_1398);
                  pmVar39->second = uVar22;
                  pSVar34 = local_13a0;
                  goto LAB_002ab544;
                }
                cVar40 = ::std::
                         _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(local_1178,&local_1398);
                if (cVar40.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur !=
                    (__node_type *)0x0) {
                  if (pRVar56->descriptor_alias != (SPIRVariable *)0x0) {
                    prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_1308._0_8_ = &local_12f8;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1308,
                               "Descriptor aliasing is currently not supported with inline UBOs.",""
                              );
                    ::std::runtime_error::runtime_error(prVar43,(string *)local_1308);
                    *(undefined ***)prVar43 = &PTR__runtime_error_003f8e68;
                    __cxa_throw(prVar43,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  uVar22 = Compiler::get_variable_data_type_id((Compiler *)pCVar51,pSVar8);
                  pSVar33 = local_13a0;
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                            (local_1390,
                             (local_13a0->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size + 1);
                  sVar5 = (pSVar33->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                  ;
                  (pSVar33->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar5].id =
                       uVar22;
                  (pSVar33->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                       sVar5 + 1;
                  uVar22 = (pSVar8->super_IVariant).self.id;
                  (*(pCVar51->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)local_1328,pCVar51,local_1360,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            ((string *)local_1308,(spirv_cross *)local_1328,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x36210b,(char (*) [2])local_1350,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_R8);
                  Compiler::set_qualified_name((Compiler *)pCVar51,uVar22,(string *)local_1308);
                  goto LAB_002ab50b;
                }
                local_1308._0_4_ = (pSVar8->super_IVariant).self.id;
                cVar41 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(local_1180,(key_type *)local_1308);
                pSVar34 = local_13a0;
                if (cVar41.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  TVar25.id = ParsedIR::increase_bound_by(local_1358,2);
                  local_1308._8_4_ = 0;
                  local_1308._0_8_ = &PTR__SPIRType_003f9270;
                  local_12f8._M_string_length = CONCAT44(local_12f8._M_string_length._4_4_,1);
                  local_12f8.field_2._8_8_ = 0;
                  local_12f8.field_2._M_allocated_capacity = (size_type)local_12d0;
                  local_12d8 = 8;
                  local_12a8 = 0;
                  local_12b0 = local_1298;
                  local_12a0 = 8;
                  local_1290 = 0;
                  local_128c._0_1_ = false;
                  local_128c._1_1_ = false;
                  local_1288 = StorageClassGeneric;
                  local_1278 = 0;
                  local_1280 = local_1268;
                  local_1270 = 8;
                  local_1240 = 0;
                  local_1248 = local_1230;
                  local_1238 = 8;
                  local_1210.id = 0;
                  local_11f8._0_4_ = 0;
                  local_11f8._4_4_ = 0;
                  local_11f0._M_buckets = &local_11f0._M_single_bucket;
                  local_11f0._M_bucket_count = 1;
                  local_11f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                  local_11f0._M_element_count = 0;
                  local_11f0._M_rehash_policy._M_max_load_factor = 1.0;
                  local_11f0._M_rehash_policy._M_next_resize = 0;
                  local_11f0._M_single_bucket = (__node_base_ptr)0x0;
                  local_1308._12_4_ = 0xb;
                  local_12f8._M_dataplus._M_p._0_4_ = 0x20;
                  local_12f8._M_dataplus._M_p._4_4_ = 1;
                  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                            ((Compiler *)pCVar51,TVar25.id,(SPIRType *)local_1308);
                  local_128c._0_1_ = true;
                  local_1290 = local_1290 + 1;
                  local_11f8._4_4_ = TVar25.id;
                  local_1288 = StorageClassStorageBuffer;
                  pSVar34 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                      ((Compiler *)pCVar51,TVar25.id + 1,(SPIRType *)local_1308);
                  pSVar33 = local_13a0;
                  (pSVar34->super_IVariant).self.id = TVar25.id;
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                            (local_1390,
                             (local_13a0->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size + 1);
                  sVar5 = (pSVar33->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                  ;
                  (pSVar33->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar5].id =
                       TVar25.id + 1;
                  (pSVar33->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                       sVar5 + 1;
                  local_1308._0_8_ = &PTR__SPIRType_003f9270;
                  ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::~_Hashtable(&local_11f0);
                  local_1240 = 0;
                  if (local_1248 != local_1230) {
                    free(local_1248);
                  }
                  local_1278 = 0;
                  if (local_1280 != local_1268) {
                    free(local_1280);
                  }
                  local_12a8 = 0;
                  if (local_12b0 != local_1298) {
                    free(local_12b0);
                  }
                  local_12f8.field_2._8_8_ = 0;
                  pSVar34 = local_13a0;
                  if ((uint *)local_12f8.field_2._M_allocated_capacity != local_12d0) {
                    free((void *)local_12f8.field_2._M_allocated_capacity);
                    pSVar34 = local_13a0;
                  }
                  goto LAB_002ab544;
                }
                pSVar42 = pRVar56->descriptor_alias;
                if ((pSVar42 == (SPIRVariable *)0x0) || (pSVar47 = pRVar56->var, pSVar42 == pSVar47)
                   ) {
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                            (local_1390,
                             (local_13a0->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size + 1);
                  sVar5 = (pSVar34->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                  ;
                  (pSVar34->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar5].id =
                       *(uint32_t *)&(pSVar8->super_IVariant).field_0xc;
                  (pSVar34->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                       sVar5 + 1;
                  pSVar42 = pRVar56->descriptor_alias;
                  if (pSVar42 != (SPIRVariable *)0x0) {
                    pSVar47 = pRVar56->var;
                    goto LAB_002ab8b2;
                  }
                }
                else {
LAB_002ab8b2:
                  if (pSVar42 != pSVar47) {
                    uVar22 = (pSVar8->super_IVariant).self.id;
                    uVar23 = (pSVar42->super_IVariant).self.id;
                    SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::reserve
                              (local_1188,
                               (pCVar51->buffer_aliases_argument).
                               super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size
                               + 1);
                    pVar53.second = uVar23;
                    pVar53.first = uVar22;
                    (pCVar51->buffer_aliases_argument).
                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr
                    [(pCVar51->buffer_aliases_argument).
                     super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size] = pVar53;
                    psVar1 = &(pCVar51->buffer_aliases_argument).
                              super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size;
                    *psVar1 = *psVar1 + 1;
                    pSVar34 = local_13a0;
                    goto LAB_002ab544;
                  }
                }
                uVar22 = (pSVar8->super_IVariant).self.id;
                if ((pSVar33->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                  (*(pCVar51->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_1328,pCVar51,local_1360,1);
                  join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            ((string *)local_1308,(spirv_cross *)"(*",(char (*) [3])local_1328,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x36210b,(char (*) [2])local_1350,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x3623fe,(char (*) [2])pCVar58);
                  Compiler::set_qualified_name((Compiler *)pCVar51,uVar22,(string *)local_1308);
                }
                else {
                  (*(pCVar51->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)local_1328,pCVar51,local_1360,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            ((string *)local_1308,(spirv_cross *)local_1328,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x36210b,(char (*) [2])local_1350,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_R8);
                  Compiler::set_qualified_name((Compiler *)pCVar51,uVar22,(string *)local_1308);
                }
              }
LAB_002ab50b:
              if ((string *)local_1308._0_8_ != &local_12f8) {
                operator_delete((void *)local_1308._0_8_);
              }
              pSVar34 = local_13a0;
              if (local_1328[0].lock != local_1318) {
                operator_delete(local_1328[0].lock);
                pSVar34 = local_13a0;
              }
            }
LAB_002ab544:
            uVar22 = (uint32_t)local_1378;
            Compiler::set_extended_member_decoration
                      ((Compiler *)pCVar51,(pSVar34->super_IVariant).self.id,(uint32_t)local_1378,
                       SPIRVCrossDecorationResourceIndexPrimary,pRVar56->index);
            value = (pSVar8->super_IVariant).self.id;
            in_R8 = (MSLResourceBinding *)(ulong)value;
            Compiler::set_extended_member_decoration
                      ((Compiler *)pCVar51,(local_13a0->super_IVariant).self.id,uVar22,
                       SPIRVCrossDecorationInterfaceOrigID,value);
            local_136c = uVar22 + 1;
            if ((ID *)CONCAT44(local_1350._4_4_,local_1350._0_4_) != (ID *)(local_1350 + 0x10)) {
              operator_delete((void *)CONCAT44(local_1350._4_4_,local_1350._0_4_));
            }
            pRVar56 = pRVar56 + 1;
          } while ((SPIRType *)pRVar56 != local_1380);
        }
      }
    }
    local_1384 = local_1384 + 1;
    if (7 < local_1384) {
      local_1170._8_8_ = 0;
      if ((SPIRType *)local_1170._0_8_ != (SPIRType *)(local_1170 + 0x18)) {
        free((void *)local_1170._0_8_);
      }
      lVar27 = 0xea8;
      do {
        SmallVector<Resource,_8UL>::~SmallVector
                  ((SmallVector<Resource,_8UL> *)
                   (local_10f8[0].stack_storage.aligned_char + lVar27 + -0x18));
        lVar27 = lVar27 + -0x218;
      } while (lVar27 != -0x218);
      return;
    }
  } while( true );
  bVar21 = sVar50 < 3;
  sVar50 = uVar52;
  if (bVar21) goto LAB_002aad61;
  goto LAB_002aad39;
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Handle descriptor aliasing as well as we can.
			// We can handle aliasing of buffers by casting pointers, but not for typed resources.
			// Inline UBOs cannot be handled since it's not a pointer, but inline data.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources_in_set[desc_set])
				{
					if (get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler && is_supported_argument_buffer_type(type))
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				add_resource_name(var_id);

				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources_in_set[desc_set].push_back(
					{ &var, descriptor_alias, to_name(var_id), type.basetype, resource_index, 0 });

				// Emulate texture2D atomic operations
				if (atomic_image_vars.count(var.self))
				{
					uint32_t buffer_resource_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
					resources_in_set[desc_set].push_back(
						{ &var, descriptor_alias, to_name(var_id) + "_atomic", SPIRType::Struct, buffer_resource_index, 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffer_requires_array_length(var_id))
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth++;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, nullptr, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		stable_sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		uint32_t next_arg_buff_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);

			// If needed, synthesize and add padding members.
			// member_index and next_arg_buff_index are incremented when padding members are added.
			if (msl_options.pad_argument_buffer_resources)
			{
				if (!resource.descriptor_alias)
				{
					while (resource.index > next_arg_buff_index)
					{
						auto &rez_bind = get_argument_buffer_resource(desc_set, next_arg_buff_index);
						switch (rez_bind.basetype)
						{
						case SPIRType::Void:
						case SPIRType::Boolean:
						case SPIRType::SByte:
						case SPIRType::UByte:
						case SPIRType::Short:
						case SPIRType::UShort:
						case SPIRType::Int:
						case SPIRType::UInt:
						case SPIRType::Int64:
						case SPIRType::UInt64:
						case SPIRType::AtomicCounter:
						case SPIRType::Half:
						case SPIRType::Float:
						case SPIRType::Double:
							add_argument_buffer_padding_buffer_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Image:
							add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Sampler:
							add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::SampledImage:
							if (next_arg_buff_index == rez_bind.msl_sampler)
								add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							else
								add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						default:
							break;
						}
					}
				}

				// Adjust the number of slots consumed by current member itself.
				// If actual member is an array, allow runtime array resolution as well.
				uint32_t elem_cnt = type.array.empty() ? 1 : to_array_size_literal(type);
				if (elem_cnt == 0)
					elem_cnt = get_resource_array_size(var.self);

				next_arg_buff_index += elem_cnt;
			}

			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with dynamic offsets.");

					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with inline UBOs.");

					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (atomic_image_vars.count(var.self))
				{
					// Emulate texture2D atomic operations.
					// Don't set the qualified name: it's already set for this variable,
					// and the code that references the buffer manually appends "_atomic"
					// to the name.
					uint32_t offset = ir.increase_bound_by(2);
					uint32_t atomic_type_id = offset;
					uint32_t type_ptr_id = offset + 1;

					SPIRType atomic_type;
					atomic_type.basetype = SPIRType::AtomicCounter;
					atomic_type.width = 32;
					atomic_type.vecsize = 1;
					set<SPIRType>(atomic_type_id, atomic_type);

					atomic_type.pointer = true;
					atomic_type.pointer_depth++;
					atomic_type.parent_type = atomic_type_id;
					atomic_type.storage = StorageClassStorageBuffer;
					auto &atomic_ptr_type = set<SPIRType>(type_ptr_id, atomic_type);
					atomic_ptr_type.self = atomic_type_id;

					buffer_type.member_types.push_back(type_ptr_id);
				}
				else
				{
					if (!resource.descriptor_alias || resource.descriptor_alias == resource.var)
						buffer_type.member_types.push_back(var.basetype);

					if (resource.descriptor_alias && resource.descriptor_alias != resource.var)
						buffer_aliases_argument.push_back({ var.self, resource.descriptor_alias->self });
					else if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}